

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int util::to_int(string *subject)

{
  int iVar1;
  variant local_50;
  string *local_10;
  string *subject_local;
  
  local_10 = subject;
  variant::variant(&local_50,subject);
  iVar1 = variant::operator_cast_to_int(&local_50);
  variant::~variant(&local_50);
  return iVar1;
}

Assistant:

int to_int(const std::string &subject)
{
	return static_cast<int>(util::variant(subject));
}